

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O3

FileBufSlot * read_normal_file(FileReader data)

{
  FILE *__stream;
  size_t __n;
  int iVar1;
  RK_U32 RVar2;
  FileBufSlot *pFVar3;
  size_t sVar4;
  
  __stream = *data;
  __n = *(size_t *)((long)data + 0x20);
  pFVar3 = (FileBufSlot *)
           mpp_osal_malloc("read_normal_file",*(long *)((long)data + 0x28) + __n + 0x28);
  pFVar3->data = (char *)(pFVar3 + 1);
  sVar4 = fread(pFVar3 + 1,1,__n,__stream);
  *(long *)((long)data + 0x40) = *(long *)((long)data + 0x40) + sVar4;
  *(size_t *)((long)data + 0x48) = sVar4;
  if (sVar4 == __n) {
    iVar1 = feof(__stream);
    if ((iVar1 == 0) && (RVar2 = 0, *(ulong *)((long)data + 0x40) < *(ulong *)((long)data + 8)))
    goto LAB_00107ad6;
  }
  RVar2 = 1;
LAB_00107ad6:
  pFVar3->buf = (MppBuffer)0x0;
  pFVar3->size = sVar4;
  pFVar3->eos = RVar2;
  return pFVar3;
}

Assistant:

static FileBufSlot *read_normal_file(FileReader data)
{
    FileReaderImpl *impl = (FileReaderImpl*)data;
    FILE *fp = impl->fp_input;
    size_t read_size = 0;
    size_t buf_size = impl->buf_size;
    size_t size = sizeof(FileBufSlot) + buf_size + impl->stuff_size;
    FileBufSlot *slot = mpp_malloc_size(FileBufSlot, size);
    RK_U32 eos = 0;

    slot->data = (char *)(slot + 1);
    read_size = fread(slot->data, 1, buf_size, fp);
    impl->read_total += read_size;
    impl->read_size = read_size;

    /* check reach eos whether or not */
    if (read_size != buf_size || feof(fp) || impl->read_total >= impl->file_size)
        eos = 1;

    slot->buf = NULL;
    slot->size  = read_size;
    slot->eos   = eos;

    return slot;
}